

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint32_t map_add_int32_col_int32_col
                   (uint32_t n,int32_t *res,int32_t *col1,int32_t *col2,uint32_t *sel)

{
  uint local_38;
  uint local_34;
  uint32_t i_1;
  uint32_t i;
  uint32_t *sel_local;
  int32_t *col2_local;
  int32_t *col1_local;
  int32_t *res_local;
  uint32_t n_local;
  
  if (sel == (uint32_t *)0x0) {
    for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
      res[local_34] = col1[local_34] + col2[local_34];
    }
  }
  else {
    for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
      res[local_38] = col1[sel[local_38]] + col2[sel[local_38]];
    }
  }
  return n;
}

Assistant:

uint32_t map_add_int32_col_int32_col(uint32_t n, int32_t *res, int32_t *col1, int32_t *col2, uint32_t *sel) {
    if (sel == nullptr) {
        for (uint32_t i = 0; i < n; i++)
            res[i] = col1[i] + col2[i];
    }
    else {
        for (uint32_t i = 0; i < n; i++)
            res[i] = col1[sel[i]] + col2[sel[i]];
    }

    return n;
}